

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_bool32
drwav_init_write__internal
          (drwav *pWav,drwav_data_format *pFormat,drwav_uint64 totalSampleCount,
          drwav_bool32 isSequential,drwav_write_proc onWrite,drwav_seek_proc onSeek,void *pUserData)

{
  long lVar1;
  int in_ECX;
  long in_RDX;
  int *in_RSI;
  void *in_RDI;
  long in_R8;
  long in_R9;
  drwav_uint64 chunkSizeDATA_1;
  drwav_uint32 chunkSizeDATA;
  drwav_uint64 chunkSizeFMT;
  drwav_uint64 chunkSizeRIFF_1;
  drwav_uint32 chunkSizeRIFF;
  drwav_uint64 initialDataChunkSize;
  size_t runningPos;
  long local_70;
  undefined4 local_64;
  long local_60;
  long local_58;
  int local_4c;
  ulong local_48;
  long local_40;
  long local_38;
  long local_30;
  int local_24;
  long local_20;
  int *local_18;
  void *local_10;
  drwav_bool32 local_4;
  
  if (in_RDI == (void *)0x0) {
    local_4 = 0;
  }
  else if (in_R8 == 0) {
    local_4 = 0;
  }
  else if ((in_ECX == 0) && (in_R9 == 0)) {
    local_4 = 0;
  }
  else if (in_RSI[1] == 0xfffe) {
    local_4 = 0;
  }
  else if ((in_RSI[1] == 2) || (in_RSI[1] == 0x11)) {
    local_4 = 0;
  }
  else {
    local_38 = in_R9;
    local_30 = in_R8;
    local_24 = in_ECX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    memset(in_RDI,0,0x1a0);
    *(long *)((long)local_10 + 8) = local_30;
    *(long *)((long)local_10 + 0x10) = local_38;
    *(drwav_uint64 *)((long)local_10 + 0x18) = chunkSizeDATA_1;
    *(short *)((long)local_10 + 0x24) = (short)local_18[1];
    *(short *)((long)local_10 + 0x26) = (short)local_18[2];
    *(int *)((long)local_10 + 0x28) = local_18[3];
    *(uint *)((long)local_10 + 0x2c) = (uint)(local_18[4] * local_18[3] * local_18[2]) >> 3;
    *(short *)((long)local_10 + 0x30) = (short)((uint)(local_18[2] * local_18[4]) >> 3);
    *(short *)((long)local_10 + 0x32) = (short)local_18[4];
    *(undefined2 *)((long)local_10 + 0x34) = 0;
    *(int *)((long)local_10 + 0x80) = local_24;
    local_40 = 0;
    local_48 = 0;
    if (((local_24 == 0) ||
        (local_48 = local_20 * (ulong)*(ushort *)((long)local_10 + 0x32) >> 3, *local_18 != 0)) ||
       (local_48 < 0xffffffdc)) {
      *(ulong *)((long)local_10 + 0x78) = local_48;
      if (*local_18 == 0) {
        local_4c = (int)local_48 + 0x24;
        lVar1 = (**(code **)((long)local_10 + 8))(chunkSizeDATA_1,"RIFF",4);
        local_40 = lVar1 + local_40;
        lVar1 = (**(code **)((long)local_10 + 8))(chunkSizeDATA_1,&local_4c,4);
        local_40 = lVar1 + local_40;
        lVar1 = (**(code **)((long)local_10 + 8))(chunkSizeDATA_1,"WAVE",4);
        local_40 = lVar1 + local_40;
      }
      else {
        local_58 = local_48 + 0x68;
        lVar1 = (**(code **)((long)local_10 + 8))(chunkSizeDATA_1,drwavGUID_W64_RIFF,0x10);
        local_40 = lVar1 + local_40;
        lVar1 = (**(code **)((long)local_10 + 8))(chunkSizeDATA_1,&local_58,8);
        local_40 = lVar1 + local_40;
        lVar1 = (**(code **)((long)local_10 + 8))(chunkSizeDATA_1,drwavGUID_W64_WAVE,0x10);
        local_40 = lVar1 + local_40;
      }
      if (*local_18 == 0) {
        local_60 = 0x10;
        lVar1 = (**(code **)((long)local_10 + 8))(chunkSizeDATA_1,"fmt ",4);
        local_40 = lVar1 + local_40;
        lVar1 = (**(code **)((long)local_10 + 8))(chunkSizeDATA_1,&local_60,4);
        local_40 = lVar1 + local_40;
      }
      else {
        local_60 = 0x28;
        lVar1 = (**(code **)((long)local_10 + 8))(chunkSizeDATA_1,drwavGUID_W64_FMT,0x10);
        local_40 = lVar1 + local_40;
        lVar1 = (**(code **)((long)local_10 + 8))(chunkSizeDATA_1,&local_60,8);
        local_40 = lVar1 + local_40;
      }
      lVar1 = (**(code **)((long)local_10 + 8))(chunkSizeDATA_1,(long)local_10 + 0x24,2);
      local_40 = lVar1 + local_40;
      lVar1 = (**(code **)((long)local_10 + 8))(chunkSizeDATA_1,(long)local_10 + 0x26,2);
      local_40 = lVar1 + local_40;
      lVar1 = (**(code **)((long)local_10 + 8))(chunkSizeDATA_1,(long)local_10 + 0x28,4);
      local_40 = lVar1 + local_40;
      lVar1 = (**(code **)((long)local_10 + 8))(chunkSizeDATA_1,(long)local_10 + 0x2c,4);
      local_40 = lVar1 + local_40;
      lVar1 = (**(code **)((long)local_10 + 8))(chunkSizeDATA_1,(long)local_10 + 0x30,2);
      local_40 = lVar1 + local_40;
      lVar1 = (**(code **)((long)local_10 + 8))(chunkSizeDATA_1,(long)local_10 + 0x32,2);
      local_40 = lVar1 + local_40;
      *(long *)((long)local_10 + 0x68) = local_40;
      if (*local_18 == 0) {
        local_64 = (undefined4)local_48;
        lVar1 = (**(code **)((long)local_10 + 8))(chunkSizeDATA_1,"data",4);
        local_40 = lVar1 + local_40;
        lVar1 = (**(code **)((long)local_10 + 8))(chunkSizeDATA_1,&local_64,4);
        local_40 = lVar1 + local_40;
      }
      else {
        local_70 = local_48 + 0x18;
        lVar1 = (**(code **)((long)local_10 + 8))(chunkSizeDATA_1,drwavGUID_W64_DATA,0x10);
        local_40 = lVar1 + local_40;
        lVar1 = (**(code **)((long)local_10 + 8))(chunkSizeDATA_1,&local_70,8);
        local_40 = lVar1 + local_40;
      }
      if (*local_18 == 0) {
        if (local_40 != local_60 + 0x1c) {
          return 0;
        }
      }
      else if (local_40 != local_60 + 0x40) {
        return 0;
      }
      *(int *)((long)local_10 + 0x20) = *local_18;
      *(short *)((long)local_10 + 0x50) = (short)local_18[2];
      *(int *)((long)local_10 + 0x4c) = local_18[3];
      *(short *)((long)local_10 + 0x52) = (short)local_18[4];
      *(short *)((long)local_10 + 0x54) = (short)local_18[1];
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

drwav_bool32 drwav_init_write__internal(drwav* pWav, const drwav_data_format* pFormat, drwav_uint64 totalSampleCount, drwav_bool32 isSequential, drwav_write_proc onWrite, drwav_seek_proc onSeek, void* pUserData)
{
    if (pWav == NULL) {
        return DRWAV_FALSE;
    }

    if (onWrite == NULL) {
        return DRWAV_FALSE;
    }

    if (!isSequential && onSeek == NULL) {
        return DRWAV_FALSE; // <-- onSeek is required when in non-sequential mode.
    }


    // Not currently supporting compressed formats. Will need to add support for the "fact" chunk before we enable this.
    if (pFormat->format == DR_WAVE_FORMAT_EXTENSIBLE) {
        return DRWAV_FALSE;
    }
    if (pFormat->format == DR_WAVE_FORMAT_ADPCM || pFormat->format == DR_WAVE_FORMAT_DVI_ADPCM) {
        return DRWAV_FALSE;
    }


    drwav_zero_memory(pWav, sizeof(*pWav));
    pWav->onWrite = onWrite;
    pWav->onSeek = onSeek;
    pWav->pUserData = pUserData;
    pWav->fmt.formatTag = (drwav_uint16)pFormat->format;
    pWav->fmt.channels = (drwav_uint16)pFormat->channels;
    pWav->fmt.sampleRate = pFormat->sampleRate;
    pWav->fmt.avgBytesPerSec = (drwav_uint32)((pFormat->bitsPerSample * pFormat->sampleRate * pFormat->channels) / 8);
    pWav->fmt.blockAlign = (drwav_uint16)((pFormat->channels * pFormat->bitsPerSample) / 8);
    pWav->fmt.bitsPerSample = (drwav_uint16)pFormat->bitsPerSample;
    pWav->fmt.extendedSize = 0;
    pWav->isSequentialWrite = isSequential;


    size_t runningPos = 0;

    // The initial values for the "RIFF" and "data" chunks depends on whether or not we are initializing in sequential mode or not. In
    // sequential mode we set this to its final values straight away since they can be calculated from the total sample count. In non-
    // sequential mode we initialize it all to zero and fill it out in drwav_uninit() using a backwards seek.
    drwav_uint64 initialDataChunkSize = 0;
    if (isSequential) {
        initialDataChunkSize = (totalSampleCount * pWav->fmt.bitsPerSample) / 8;

        // The RIFF container has a limit on the number of samples. drwav is not allowing this. There's no practical limits for Wave64
        // so for the sake of simplicity I'm not doing any validation for that.
        if (pFormat->container == drwav_container_riff) {
            if (initialDataChunkSize > (0xFFFFFFFF - 36)) {
                return DRWAV_FALSE; // Not enough room to store every sample.
            }
        }
    }

    pWav->dataChunkDataSizeTargetWrite = initialDataChunkSize;


    // "RIFF" chunk.
    if (pFormat->container == drwav_container_riff) {
        drwav_uint32 chunkSizeRIFF = 36 + (drwav_uint32)initialDataChunkSize;   // +36 = "RIFF"+[RIFF Chunk Size]+"WAVE" + [sizeof "fmt " chunk]
        runningPos += pWav->onWrite(pUserData, "RIFF", 4);
        runningPos += pWav->onWrite(pUserData, &chunkSizeRIFF, 4);
        runningPos += pWav->onWrite(pUserData, "WAVE", 4);
    } else {
        drwav_uint64 chunkSizeRIFF = 80 + 24 + initialDataChunkSize;   // +24 because W64 includes the size of the GUID and size fields.
        runningPos += pWav->onWrite(pUserData, drwavGUID_W64_RIFF, 16);
        runningPos += pWav->onWrite(pUserData, &chunkSizeRIFF, 8);
        runningPos += pWav->onWrite(pUserData, drwavGUID_W64_WAVE, 16);
    }

    // "fmt " chunk.
    drwav_uint64 chunkSizeFMT;
    if (pFormat->container == drwav_container_riff) {
        chunkSizeFMT = 16;
        runningPos += pWav->onWrite(pUserData, "fmt ", 4);
        runningPos += pWav->onWrite(pUserData, &chunkSizeFMT, 4);
    } else {
        chunkSizeFMT = 40;
        runningPos += pWav->onWrite(pUserData, drwavGUID_W64_FMT, 16);
        runningPos += pWav->onWrite(pUserData, &chunkSizeFMT, 8);
    }

    runningPos += pWav->onWrite(pUserData, &pWav->fmt.formatTag,      2);
    runningPos += pWav->onWrite(pUserData, &pWav->fmt.channels,       2);
    runningPos += pWav->onWrite(pUserData, &pWav->fmt.sampleRate,     4);
    runningPos += pWav->onWrite(pUserData, &pWav->fmt.avgBytesPerSec, 4);
    runningPos += pWav->onWrite(pUserData, &pWav->fmt.blockAlign,     2);
    runningPos += pWav->onWrite(pUserData, &pWav->fmt.bitsPerSample,  2);

    pWav->dataChunkDataPos = runningPos;

    // "data" chunk.
    if (pFormat->container == drwav_container_riff) {
        drwav_uint32 chunkSizeDATA = (drwav_uint32)initialDataChunkSize;
        runningPos += pWav->onWrite(pUserData, "data", 4);
        runningPos += pWav->onWrite(pUserData, &chunkSizeDATA, 4);
    } else {
        drwav_uint64 chunkSizeDATA = 24 + initialDataChunkSize; // +24 because W64 includes the size of the GUID and size fields.
        runningPos += pWav->onWrite(pUserData, drwavGUID_W64_DATA, 16);
        runningPos += pWav->onWrite(pUserData, &chunkSizeDATA, 8);
    }


    // Simple validation.
    if (pFormat->container == drwav_container_riff) {
        if (runningPos != 20 + chunkSizeFMT + 8) {
            return DRWAV_FALSE;
        }
    } else {
        if (runningPos != 40 + chunkSizeFMT + 24) {
            return DRWAV_FALSE;
        }
    }
    


    // Set some properties for the client's convenience.
    pWav->container = pFormat->container;
    pWav->channels = (drwav_uint16)pFormat->channels;
    pWav->sampleRate = pFormat->sampleRate;
    pWav->bitsPerSample = (drwav_uint16)pFormat->bitsPerSample;
    pWav->translatedFormatTag = (drwav_uint16)pFormat->format;

    return DRWAV_TRUE;
}